

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O2

void sigmund_getrawpeaks(int npts,t_float *insamps,int npeak,t_peak_conflict *peakv,int *nfound,
                        t_float *power,t_float srate,int loud,t_float hifreq)

{
  t_peak_conflict *ptVar1;
  uint *puVar2;
  uint *puVar3;
  undefined1 auVar4 [16];
  undefined8 __x;
  t_sample *ptVar5;
  t_sample *ptVar6;
  t_sample *ptVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  undefined4 in_register_00000014;
  double dVar11;
  int npts_00;
  t_sample *ptVar12;
  undefined4 in_register_0000003c;
  long lVar13;
  int iVar14;
  long lVar15;
  t_sample *ptVar16;
  int npeak_00;
  ulong uVar17;
  int bestindex;
  long lVar18;
  uint uVar19;
  float fVar20;
  t_float tVar21;
  uint uVar22;
  undefined4 uVar23;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar24;
  undefined4 extraout_XMM0_Dd;
  float fVar25;
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  double local_c0;
  int *local_b8;
  ulong local_b0;
  undefined1 local_a8 [16];
  float local_98;
  undefined4 uStack_94;
  t_peak_conflict *local_88;
  t_sample *local_80;
  undefined1 local_78 [16];
  float local_68;
  uint local_64;
  double local_60;
  t_sample *local_58;
  ulong local_50;
  double local_48;
  t_sample *local_40;
  uint local_34;
  
  local_50 = CONCAT44(in_register_0000003c,npts);
  local_48 = (double)CONCAT44(in_register_00000014,npeak);
  ptVar12 = (t_sample *)local_118;
  local_a8._8_8_ = local_a8._0_8_;
  local_a8._0_8_ = power;
  local_d8 = ZEXT416((uint)(1.0 / (float)npts));
  local_60 = (double)(1.0 / (float)npts);
  dVar29 = (double)srate * 0.5 * local_60;
  uStack_94 = (undefined4)((ulong)dVar29 >> 0x20);
  local_98 = (float)dVar29;
  local_64 = npts * 0x18 + 0x20;
  local_b0 = (ulong)local_64;
  local_b8 = nfound;
  local_88 = peakv;
  if ((int)local_64 < 400000) {
    ptVar12 = (t_sample *)(local_118 + -((long)(int)local_64 + 0xfU & 0xfffffffffffffff0));
    ptVar7 = ptVar12;
  }
  else {
    local_78._0_4_ = hifreq;
    ptVar7 = (t_sample *)getbytes(local_b0);
    hifreq = (t_float)local_78._0_4_;
  }
  fVar25 = hifreq / local_98;
  iVar14 = (int)local_50;
  lVar18 = (long)(npts * 2);
  lVar15 = (long)iVar14;
  local_78._0_8_ = ptVar7 + lVar18 + lVar15 * 2;
  local_40 = ptVar7 + lVar18 + lVar15 * 2 + lVar15 + 4;
  uVar9 = 0;
  uVar17 = 0;
  if (0 < iVar14) {
    uVar17 = local_50 & 0xffffffff;
  }
  for (; uVar17 != uVar9; uVar9 = uVar9 + 1) {
    ptVar7[lVar18 + uVar9] = 0.0;
  }
  local_34 = (int)fVar25;
  if ((int)(iVar14 - 4U) < (int)fVar25) {
    local_34 = iVar14 - 4U;
  }
  for (uVar9 = 0; lVar13 = lVar15, uVar17 != uVar9; uVar9 = uVar9 + 1) {
    ptVar7[uVar9] = insamps[uVar9];
  }
  for (; lVar13 < lVar18; lVar13 = lVar13 + 1) {
    ptVar7[lVar13] = 0.0;
  }
  local_80 = ptVar7;
  local_58 = ptVar7 + lVar18 + lVar15 * 2 + 4;
  ptVar12[-2] = 2.403353e-39;
  ptVar12[-1] = 0.0;
  mayer_realfft(npts * 2,ptVar7);
  ptVar5 = local_80;
  for (uVar9 = 0; uVar17 != uVar9; uVar9 = uVar9 + 1) {
    local_58[uVar9] = local_80[uVar9];
  }
  local_40 = local_40 + 4;
  lVar8 = (long)((int)local_50 + -1);
  ptVar16 = local_80 + lVar18;
  ptVar12[-2] = 1.26117e-44;
  ptVar12[-1] = 0.0;
  for (lVar13 = *(long *)(ptVar12 + -2); ptVar16 = ptVar16 + -1, lVar13 + -8 < lVar8;
      lVar13 = lVar13 + 1) {
    ptVar7[lVar18 + lVar15 * 3 + lVar13] = *ptVar16;
  }
  *(undefined4 *)local_78._0_8_ = *(undefined4 *)(local_78._0_8_ + 0x20);
  *(undefined4 *)(local_78._0_8_ + 4) = *(undefined4 *)(local_78._0_8_ + 0x1c);
  *(undefined4 *)(local_78._0_8_ + 8) = *(undefined4 *)(local_78._0_8_ + 0x18);
  *(undefined4 *)(local_78._0_8_ + 0xc) = *(undefined4 *)(local_78._0_8_ + 0x14);
  local_40[lVar8] = 0.0;
  *(undefined4 *)(local_78._0_8_ + (lVar15 + 8) * 4) = 0;
  puVar2 = (uint *)(local_78._0_8_ + (lVar15 + 9) * 4);
  uVar22 = *puVar2;
  uVar19 = puVar2[1];
  uVar10 = puVar2[2];
  puVar3 = (uint *)(local_78._0_8_ + (lVar15 + 4) * 4);
  *puVar3 = puVar2[3] ^ 0x80000000;
  puVar3[1] = uVar10 ^ 0x80000000;
  puVar3[2] = uVar19 ^ 0x80000000;
  puVar3[3] = uVar22 ^ 0x80000000;
  uVar9 = 0;
  uVar17 = 0;
  if (0 < (int)local_34) {
    uVar17 = (ulong)local_34;
  }
  fVar25 = 0.0;
  for (; uVar17 != uVar9; uVar9 = uVar9 + 1) {
    fVar20 = (ptVar5[lVar15 * 2 + lVar18 + uVar9 + 5] - ptVar5[lVar15 * 2 + lVar18 + uVar9 + 3]) *
             (ptVar5[lVar15 * 2 + lVar18 + uVar9 + 5] - ptVar5[lVar15 * 2 + lVar18 + uVar9 + 3]) +
             (ptVar5[lVar18 + lVar15 * 3 + uVar9 + 9] - ptVar5[lVar18 + lVar15 * 3 + uVar9 + 7]) *
             (ptVar5[lVar18 + lVar15 * 3 + uVar9 + 9] - ptVar5[lVar18 + lVar15 * 3 + uVar9 + 7]);
    ptVar7[lVar18 + lVar15 + uVar9] = fVar20;
    if (1 < uVar9) {
      fVar25 = fVar25 + fVar20;
    }
  }
  lVar13 = (long)(int)local_34;
  (ptVar7 + lVar18 + lVar15 + lVar13)[0] = 0.0;
  (ptVar7 + lVar18 + lVar15 + lVar13)[1] = 0.0;
  local_c0 = (double)fVar25 * 1e-10;
  dVar11 = 0.0;
  dVar29 = (double)((ulong)local_48 & 0xffffffff);
  if (SUB84(local_48,0) < 1) {
    dVar29 = dVar11;
  }
  local_48 = dVar29;
  *(float *)local_a8._0_8_ = (float)((double)fVar25 * 0.5 * local_60 * local_60);
  local_68 = fVar25;
  ptVar16 = ptVar5;
  do {
    fVar25 = local_68;
    iVar14 = (int)ptVar16;
    dVar29 = local_48;
    if (dVar11 == local_48) {
LAB_001a2ffc:
      ptVar5 = local_40;
      ptVar7 = local_58;
      ptVar1 = local_88;
      fVar25 = local_98;
      npts_00 = (int)local_50;
      npeak_00 = SUB84(dVar29,0);
      ptVar12[-2] = 2.40499e-39;
      ptVar12[-1] = 0.0;
      sigmund_tweak(npts_00,ptVar7,ptVar5,npeak_00,ptVar1,fVar25,iVar14);
      fVar25 = local_98;
      ptVar12[-2] = 2.405026e-39;
      ptVar12[-1] = 0.0;
      sigmund_tweak(npts_00,ptVar7,ptVar5,npeak_00,ptVar1,fVar25,iVar14);
      for (lVar15 = 0; ptVar7 = local_80, uVar9 = local_b0,
          ((ulong)dVar29 & 0xffffffff) << 5 != lVar15; lVar15 = lVar15 + 0x20) {
        tVar21 = *(t_float *)((long)&ptVar1->p_freq + lVar15);
        ptVar12[-2] = 2.405063e-39;
        ptVar12[-1] = 0.0;
        tVar21 = sigmund_ftom(tVar21);
        *(t_float *)((long)&ptVar1->p_pit + lVar15) = tVar21;
        tVar21 = *(t_float *)((long)&ptVar1->p_amp + lVar15);
        ptVar12[-2] = 2.405089e-39;
        ptVar12[-1] = 0.0;
        tVar21 = sigmund_powtodb(tVar21);
        *(t_float *)((long)&ptVar1->p_db + lVar15) = tVar21;
      }
      *local_b8 = npeak_00;
      if (399999 < (int)local_64) {
        ptVar12[-2] = 2.405156e-39;
        ptVar12[-1] = 0.0;
        freebytes(ptVar7,uVar9);
      }
      return;
    }
    fVar20 = 0.0;
    uVar22 = 0;
    uVar23 = 0;
    uVar24 = 0;
    ptVar12[-2] = 2.8026e-45;
    ptVar12[-1] = 0.0;
    uVar9 = *(ulong *)(ptVar12 + -2);
    ptVar12[-2] = -NAN;
    ptVar6 = local_58;
    ptVar12[-1] = -NAN;
    uVar17 = *(ulong *)(ptVar12 + -2) & 0xffffffff;
    for (; (long)uVar9 < lVar13; uVar9 = uVar9 + 1) {
      fVar28 = ptVar7[lVar18 + lVar15 + uVar9];
      if ((fVar20 < fVar28) &&
         (ptVar5[lVar18 + uVar9] <= fVar28 && fVar28 != ptVar5[lVar18 + uVar9])) {
        dVar29 = (double)(ptVar7[lVar18 + lVar15 + (uVar9 - 2)] +
                         ptVar7[lVar18 + lVar15 + uVar9 + 2]) * 0.6;
        fVar27 = (float)dVar29;
        uVar19 = -(uint)(fVar27 < fVar28);
        auVar30._0_4_ = ~uVar19 & (uint)fVar20;
        auVar30._4_4_ = ~(uint)((ulong)dVar29 >> 0x20) & uVar22;
        auVar30._8_4_ = uVar23;
        auVar30._12_4_ = uVar24;
        auVar30 = auVar30 | ZEXT416((uint)fVar28 & uVar19);
        if (fVar27 < fVar28) {
          uVar17 = uVar9 & 0xffffffff;
        }
        fVar20 = auVar30._0_4_;
        uVar22 = auVar30._4_4_;
        uVar23 = auVar30._8_4_;
        uVar24 = auVar30._12_4_;
      }
    }
    if (((fVar25 <= 0.0) || ((double)fVar20 < local_c0)) || (uVar22 = (uint)uVar17, (int)uVar22 < 0)
       ) {
      dVar29 = (double)((ulong)dVar11 & 0xffffffff);
      goto LAB_001a2ffc;
    }
    local_60 = dVar11;
    uVar19 = uVar22 + 0x32;
    if ((int)(uVar22 + 0x32) <= (int)local_34) {
      uVar19 = local_34;
    }
    ptVar12[-2] = 7.28675e-44;
    ptVar12[-1] = 0.0;
    uVar9 = *(ulong *)(ptVar12 + -2) & 0xffffffff;
    if (0x34 < uVar22) {
      uVar9 = uVar17;
    }
    uVar10 = ((int)uVar9 - uVar22) - 0x32;
    for (uVar9 = uVar9 - 0x32; uVar9 < uVar19; uVar9 = uVar9 + 1) {
      fVar28 = (float)(int)uVar10;
      uVar10 = uVar10 + 1;
      fVar25 = fVar20 + fVar20;
      if (2 < uVar10) {
        fVar25 = (float)((double)fVar20 / ((double)(fVar28 * fVar28 * fVar28 * fVar28) + 1.0));
      }
      if (ptVar7[lVar18 + uVar9] <= fVar25 && fVar25 != ptVar7[lVar18 + uVar9]) {
        ptVar7[lVar18 + uVar9] = fVar25;
      }
    }
    fVar25 = ptVar6[uVar17 - 1];
    fVar20 = ptVar6[uVar17 + 1];
    fVar34 = fVar20 - fVar25;
    fVar28 = local_40[uVar17 - 1];
    fVar27 = local_40[uVar17 + 1];
    fVar33 = fVar27 - fVar28;
    local_118 = ZEXT416((uint)fVar33);
    local_78 = ZEXT416((uint)fVar34);
    fVar33 = fVar34 * fVar34 + fVar33 * fVar33;
    fVar28 = fVar27 * fVar27 - fVar28 * fVar28;
    local_f8 = ZEXT416((uint)fVar33);
    fVar25 = (fVar28 + (fVar20 * fVar20 - fVar25 * fVar25)) / (fVar33 + fVar33);
    local_108 = 0.5;
    fStack_104 = 0.0;
    if ((fVar25 <= 0.5) && (local_108 = fVar25, fStack_104 = fVar28, fVar25 < -0.5)) {
      local_108 = -0.5;
      fStack_104 = 0.0;
    }
    fVar25 = local_108 * 3.1415927;
    local_a8._8_4_ = fStack_104;
    local_a8._0_8_ = (double)fVar25;
    local_a8._12_4_ = fStack_104;
    fStack_100 = fStack_104;
    fStack_fc = fStack_104;
    ptVar12[-2] = 2.40449e-39;
    ptVar12[-1] = 0.0;
    dVar29 = sin((double)fVar25);
    local_e8._8_4_ = extraout_XMM0_Dc;
    local_e8._0_8_ = dVar29;
    local_e8._12_4_ = extraout_XMM0_Dd;
    __x = local_a8._0_8_;
    ptVar12[-2] = 2.404517e-39;
    ptVar12[-1] = 0.0;
    dVar29 = cos((double)__x);
    fVar25 = (float)dVar29;
    auVar31._0_4_ = (float)((double)local_a8._0_8_ + 1.5707963267948966);
    auVar31._4_4_ = (float)((double)local_a8._0_8_ + -1.5707963267948966);
    auVar31._8_8_ = 0;
    auVar26._0_8_ = CONCAT44(fVar25,fVar25) ^ 0x8000000000000000;
    auVar26._8_8_ = 0;
    auVar30 = divps(auVar26,auVar31);
    uVar19 = (uint)-(ulong)(ABS(auVar31._4_4_) < 0.003);
    auVar32._0_8_ = CONCAT44(uVar19,-(uint)(ABS(auVar31._0_4_) < 0.003)) & 0x3f8000003f800000;
    auVar32._8_8_ = 0;
    auVar4._4_4_ = ~uVar19 & auVar30._4_4_;
    auVar4._0_4_ = ~-(uint)(ABS(auVar31._0_4_) < 0.003) & auVar30._0_4_;
    auVar4._8_4_ = ~uVar19 & auVar30._8_4_;
    auVar4._12_4_ = ~(uint)(-(ulong)(ABS(auVar31._4_4_) < 0.003) >> 0x20) & auVar30._12_4_;
    fVar20 = 1.0 / (SUB164(auVar32 | auVar4,4) + SUB164(auVar32 | auVar4,0));
    ptVar1 = local_88 + (long)local_60;
    ptVar1->p_freq = local_98 * (local_108 + local_108 + (float)(int)uVar22);
    ptVar1->p_amp = fVar20 * SQRT((float)local_f8._0_4_) * (float)local_d8._0_4_;
    ptVar1->p_ampreal =
         fVar20 * ((float)local_78._0_4_ * fVar25 +
                  (float)(double)local_e8._0_8_ * -(float)local_118._0_4_) * (float)local_d8._0_4_;
    ptVar1->p_ampimag =
         fVar20 * ((float)local_78._0_4_ * (float)(double)local_e8._0_8_ +
                  fVar25 * (float)local_118._0_4_) * (float)local_d8._0_4_;
    dVar11 = (double)((long)local_60 + 1);
  } while( true );
}

Assistant:

static void sigmund_getrawpeaks(int npts, t_float *insamps,
    int npeak, t_peak *peakv, int *nfound, t_float *power, t_float srate,
    int loud, t_float hifreq)
{
    t_float oneovern = 1.0/ (t_float)npts;
    t_float fperbin = 0.5 * srate * oneovern, totalpower = 0;
    int npts2 = 2*npts, i, bin, bufsize = sizeof (t_float ) *
        (2*NEGBINS + 6*npts);
    int peakcount = 0;
    t_float *fp1, *fp2;
    t_float *rawreal, *rawimag, *maskbuf, *powbuf;
    t_float *bigbuf = (t_float *)BUF_ALLOCA(bufsize);
    int maxbin = hifreq/fperbin;
    if (maxbin > npts - NEGBINS)
        maxbin = npts - NEGBINS;
    /* if (loud) post("tweak %d", tweak); */
    maskbuf = bigbuf + npts2;
    powbuf = maskbuf + npts;
    rawreal = powbuf + npts+NEGBINS;
    rawimag = rawreal+npts+NEGBINS;
    for (i = 0; i < npts; i++)
        maskbuf[i] = 0;

    for (i = 0; i < npts; i++)
        bigbuf[i] = insamps[i];
    for (i = npts; i < 2*npts; i++)
        bigbuf[i] = 0;
    mayer_realfft(npts2, bigbuf);
    for (i = 0; i < npts; i++)
        rawreal[i] = bigbuf[i];
    for (i = 1; i < npts-1; i++)
        rawimag[i] = bigbuf[npts2-i];
    rawreal[-1] = rawreal[1];
    rawreal[-2] = rawreal[2];
    rawreal[-3] = rawreal[3];
    rawreal[-4] = rawreal[4];
    rawimag[0] = rawimag[npts-1] = 0;
    rawimag[-1] = -rawimag[1];
    rawimag[-2] = -rawimag[2];
    rawimag[-3] = -rawimag[3];
    rawimag[-4] = -rawimag[4];
#if 1
    for (i = 0, fp1 = rawreal, fp2 = rawimag; i < maxbin; i++, fp1++, fp2++)
    {
        t_float x1 = fp1[1] - fp1[-1], x2 = fp2[1] - fp2[-1],
            p = powbuf[i] = x1*x1+x2*x2;
        if (i >= 2)
           totalpower += p;
    }
    powbuf[maxbin] = powbuf[maxbin+1] = 0;
    *power = 0.5 * totalpower *oneovern * oneovern;
#endif
    for (peakcount = 0; peakcount < npeak; peakcount++)
    {
        t_float pow1, maxpower = 0, windreal, windimag, windpower,
            detune, pidetune, sinpidetune, cospidetune, ampcorrect, ampout,
            ampoutreal, ampoutimag, freqout, powmask;
        int bestindex = -1;

        for (bin = 2, fp1 = rawreal+2, fp2 = rawimag+2;
            bin < maxbin; bin++, fp1++, fp2++)
        {
            pow1 = powbuf[bin];
            if (pow1 > maxpower && pow1 > maskbuf[bin])
            {
                t_float thresh = PEAKTHRESHFACTOR *
                    (powbuf[bin-2]+powbuf[bin+2]);
                if (pow1 > thresh)
                    maxpower = pow1, bestindex = bin;
            }
        }

        if (totalpower <= 0 || maxpower < 1e-10*totalpower || bestindex < 0)
            break;
        fp1 = rawreal+bestindex;
        fp2 = rawimag+bestindex;
        powmask = maxpower * PEAKMASKFACTOR;
        /* if (loud > 2)
            post("maxpower %f, powmask %f, param1 %f",
                maxpower, powmask, param1); */
        sigmund_remask(maxbin, bestindex, powmask, maxpower, maskbuf);
        
        /* if (loud > 1)
            post("best index %d, total power %f", bestindex, totalpower); */

        windreal = fp1[1] - fp1[-1];
        windimag = fp2[1] - fp2[-1];
        windpower = windreal * windreal + windimag * windimag;
        detune = ((fp1[1] * fp1[1] - fp1[-1]*fp1[-1]) 
            + (fp2[1] * fp2[1] - fp2[-1]*fp2[-1])) / (2 * windpower);

        if (detune > 0.5)
            detune = 0.5;
        else if (detune < -0.5)
            detune = -0.5;
        /* if (loud > 1)
            post("windpower %f, index %d, detune %f",
                windpower, bestindex, detune); */
        pidetune = PI * detune;
        sinpidetune = sin(pidetune);
        cospidetune = cos(pidetune);
        ampcorrect = 1.0 / window_mag(pidetune, cospidetune);

        ampout = ampcorrect *sqrt(windpower);
        ampoutreal = ampcorrect *
            (windreal * cospidetune - windimag * sinpidetune);
        ampoutimag = ampcorrect *
            (windreal * sinpidetune + windimag * cospidetune);

            /* the frequency is the sum of the bin frequency and detuning */

        peakv[peakcount].p_freq = (freqout = (bestindex + 2*detune)) * fperbin;
        peakv[peakcount].p_amp = oneovern * ampout;
        peakv[peakcount].p_ampreal = oneovern * ampoutreal;
        peakv[peakcount].p_ampimag = oneovern * ampoutimag;
    }
    sigmund_tweak(npts, rawreal, rawimag, peakcount, peakv, fperbin, loud);
    sigmund_tweak(npts, rawreal, rawimag, peakcount, peakv, fperbin, loud);
    for (i = 0; i < peakcount; i++)
    {
        peakv[i].p_pit = sigmund_ftom(peakv[i].p_freq);
        peakv[i].p_db = sigmund_powtodb(peakv[i].p_amp);
    }
    *nfound = peakcount;
    BUF_FREEA(bigbuf, bufsize);
}